

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u8 *puVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  undefined6 in_register_00000012;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined6 in_register_00000032;
  byte bVar14;
  ulong uVar15;
  int local_4c;
  ushort local_48;
  
  uVar13 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar15 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  iVar3 = (int)CONCAT62(in_register_00000012,iSize);
  uVar10 = iVar3 + uVar13;
  puVar2 = pPage->aData;
  uVar8 = (ulong)pPage->hdrOffset;
  uVar1 = uVar8 + 1;
  uVar11 = uVar1;
  local_4c = iVar3;
  if ((puVar2[uVar8 + 2] == '\0') && (puVar2[uVar1] == '\0')) {
    local_48 = 0;
    uVar12 = uVar1;
  }
  else {
    do {
      uVar12 = uVar11;
      uVar6 = *(ushort *)(puVar2 + uVar12);
      local_48 = uVar6 << 8 | uVar6 >> 8;
      uVar11 = (ulong)local_48;
      if ((ushort)uVar15 <= local_48) goto LAB_00159035;
    } while ((ushort)uVar12 < local_48);
    if (local_48 != 0) {
      uVar9 = 0x11c14;
      goto LAB_00159072;
    }
LAB_00159035:
    uVar5 = pPage->pBt->usableSize;
    uVar7 = (uint)local_48;
    if (uVar5 - 4 < uVar7) {
      uVar9 = 0x11c19;
      goto LAB_00159072;
    }
    if (uVar10 + 3 < uVar7 || local_48 == 0) {
      bVar14 = 0;
    }
    else {
      bVar14 = (char)(uVar6 >> 8) - (char)uVar10;
      if (local_48 < uVar10) {
        uVar9 = 0x11c25;
        goto LAB_00159072;
      }
      uVar10 = (ushort)(*(ushort *)(puVar2 + uVar11 + 2) << 8 |
                       *(ushort *)(puVar2 + uVar11 + 2) >> 8) + uVar7;
      if (uVar5 < uVar10) {
        uVar9 = 0x11c28;
        goto LAB_00159072;
      }
      local_4c = uVar10 - uVar13;
      local_48 = *(ushort *)(puVar2 + uVar11) << 8 | *(ushort *)(puVar2 + uVar11) >> 8;
    }
    uVar5 = (uint)uVar12;
    if ((uint)uVar1 < uVar5) {
      uVar6 = *(ushort *)(puVar2 + uVar12 + 2) << 8 | *(ushort *)(puVar2 + uVar12 + 2) >> 8;
      bVar4 = true;
      if (uVar13 <= uVar6 + uVar5 + 3) {
        uVar7 = uVar6 + uVar5;
        if (uVar13 < uVar7) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11c35,
                      "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
          bVar4 = false;
        }
        else {
          bVar14 = bVar14 + ((char)iStart - (char)uVar7);
          local_4c = uVar10 - uVar5;
          uVar15 = uVar12;
          bVar4 = true;
        }
      }
      if (!bVar4) {
        return 0xb;
      }
    }
    if (puVar2[uVar8 + 7] < bVar14) {
      uVar9 = 0x11c3b;
      goto LAB_00159072;
    }
    puVar2[uVar8 + 7] = puVar2[uVar8 + 7] - bVar14;
  }
  uVar6 = *(ushort *)(puVar2 + uVar8 + 5);
  uVar11 = uVar15 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + uVar11,0,(ulong)(ushort)local_4c);
  }
  uVar13 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
  if ((uint)uVar11 <= uVar13) {
    if ((uint)uVar11 < uVar13) {
      uVar9 = 0x11c49;
    }
    else {
      if ((uint)uVar1 == (uint)uVar12) {
        *(ushort *)(puVar2 + uVar1) = local_48 << 8 | local_48 >> 8;
        puVar2[uVar8 + 5] = (u8)(uVar10 >> 8);
        puVar2[uVar8 + 6] = (u8)uVar10;
        goto LAB_001592aa;
      }
      uVar9 = 0x11c4a;
    }
LAB_00159072:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    return 0xb;
  }
  *(ushort *)(puVar2 + uVar12) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
  puVar2[uVar11] = (u8)(local_48 >> 8);
  puVar2[uVar11 + 1] = (u8)local_48;
  puVar2[uVar11 + 2] = (u8)((uint)local_4c >> 8);
  puVar2[uVar11 + 3] = (u8)local_4c;
LAB_001592aa:
  pPage->nFree = pPage->nFree + iVar3;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( CORRUPT_DB || iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}